

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

void __thiscall QCborValue::QCborValue(QCborValue *this,QCborTag tag,QCborValue *tv)

{
  Type TVar1;
  undefined4 *puVar2;
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_38;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0xffffffffffffffff;
  puVar2 = (undefined4 *)operator_new(0x40);
  *(undefined8 *)(puVar2 + 2) = 0;
  *(undefined8 *)(puVar2 + 4) = 0;
  *(undefined8 *)(puVar2 + 6) = 0;
  *(undefined8 *)(puVar2 + 8) = 0;
  *(undefined8 *)(puVar2 + 10) = 0;
  *(undefined8 *)(puVar2 + 0xc) = 0;
  *(undefined8 *)(puVar2 + 0xe) = 0;
  *(undefined4 **)(this + 8) = puVar2;
  *(undefined4 *)(this + 0x10) = 0xc0;
  *puVar2 = 1;
  local_30 = 0xc0;
  local_38 = (anon_union_8_2_4ee71171_for_Element_0)tag;
  QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element>
            ((QPodArrayOps<QtCbor::Element> *)(puVar2 + 10),0,(Element *)&local_38);
  QList<QtCbor::Element>::end((QList<QtCbor::Element> *)(puVar2 + 10));
  QCborContainerPrivate::insertAt
            (*(QCborContainerPrivate **)(this + 8),
             ((*(QCborContainerPrivate **)(this + 8))->elements).d.size,tv,CopyContainer);
  TVar1 = convertToExtendedType(*(QCborContainerPrivate **)(this + 8));
  *(Type *)(this + 0x10) = TVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QCborValue::QCborValue(QCborTag tag, const QCborValue &tv)
    : n(-1), container(new QCborContainerPrivate), t(Tag)
{
    container->ref.storeRelaxed(1);
    container->append(tag);
    container->append(tv);
    t = convertToExtendedType(container);
}